

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_settablesize(FuncState *fs,int pc,int ra,int asize,int hsize)

{
  Instruction *pIVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  
  pIVar1 = fs->f->code;
  if (hsize == 0) {
    uVar3 = 0;
  }
  else {
    bVar2 = luaO_ceillog2(hsize);
    uVar3 = (uint)bVar2 * 0x10000 + 0x10000;
  }
  iVar4 = asize + 0x3ff;
  if (-1 < asize) {
    iVar4 = asize;
  }
  pIVar1[pc] = (uint)(0x3ff < asize) << 0xf | asize << 0x16 | ra << 7 | uVar3 | 0x13;
  pIVar1[(long)pc + 1] = (iVar4 >> 10) << 7 | 0x52;
  return;
}

Assistant:

void luaK_settablesize (FuncState *fs, int pc, int ra, int asize, int hsize) {
  Instruction *inst = &fs->f->code[pc];
  int extra = asize / (MAXARG_vC + 1);  /* higher bits of array size */
  int rc = asize % (MAXARG_vC + 1);  /* lower bits of array size */
  int k = (extra > 0);  /* true iff needs extra argument */
  hsize = (hsize != 0) ? luaO_ceillog2(cast_uint(hsize)) + 1 : 0;
  *inst = CREATE_vABCk(OP_NEWTABLE, ra, hsize, rc, k);
  *(inst + 1) = CREATE_Ax(OP_EXTRAARG, extra);
}